

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O1

uint LZ4HC_countPattern(BYTE *ip,BYTE *iEnd,U32 pattern32)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong *puVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  iVar7 = (int)ip;
  uVar6 = CONCAT44(pattern32,pattern32);
  while (ip < iEnd + -7) {
    uVar1 = *(ulong *)ip;
    uVar8 = uVar1 ^ uVar6;
    uVar2 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    iVar3 = (int)ip;
    ip = (BYTE *)((long)ip + 8);
    if (uVar1 != uVar6) {
      return (((uint)(uVar2 >> 3) & 0x1fffffff) + iVar3) - iVar7;
    }
  }
  puVar5 = (ulong *)ip;
  if (ip < iEnd) {
    lVar4 = (long)iEnd - (long)ip;
    do {
      puVar5 = (ulong *)ip;
      if ((char)*(ulong *)ip != (char)uVar6) break;
      ip = (BYTE *)((long)ip + 1);
      uVar6 = uVar6 >> 8;
      lVar4 = lVar4 + -1;
      puVar5 = (ulong *)iEnd;
    } while (lVar4 != 0);
  }
  return (int)puVar5 - iVar7;
}

Assistant:

static unsigned
LZ4HC_countPattern(const BYTE* ip, const BYTE* const iEnd, U32 const pattern32)
{
    const BYTE* const iStart = ip;
    reg_t const pattern = (sizeof(pattern)==8) ?
        (reg_t)pattern32 + (((reg_t)pattern32) << (sizeof(pattern)*4)) : pattern32;

    while (likely(ip < iEnd-(sizeof(pattern)-1))) {
        reg_t const diff = LZ4_read_ARCH(ip) ^ pattern;
        if (!diff) { ip+=sizeof(pattern); continue; }
        ip += LZ4_NbCommonBytes(diff);
        return (unsigned)(ip - iStart);
    }

    if (LZ4_isLittleEndian()) {
        reg_t patternByte = pattern;
        while ((ip<iEnd) && (*ip == (BYTE)patternByte)) {
            ip++; patternByte >>= 8;
        }
    } else {  /* big endian */
        U32 bitOffset = (sizeof(pattern)*8) - 8;
        while (ip < iEnd) {
            BYTE const byte = (BYTE)(pattern >> bitOffset);
            if (*ip != byte) break;
            ip ++; bitOffset -= 8;
        }
    }

    return (unsigned)(ip - iStart);
}